

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

date_t duckdb::DateTrunc::
       UnaryFunction<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::MillenniumOperator>
                 (timestamp_t input)

{
  bool bVar1;
  date_t dVar2;
  undefined1 auVar3 [16];
  date_t result;
  date_t local_3c;
  string local_38;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>(input);
  if (bVar1) {
    dVar2 = MillenniumOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
    return (date_t)dVar2.days;
  }
  bVar1 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::date_t>(input,&local_3c,false);
  if (bVar1) {
    return (date_t)local_3c.days;
  }
  auVar3 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::timestamp_t,duckdb::date_t>
            (&local_38,(duckdb *)input.value,(timestamp_t)auVar3._8_8_);
  duckdb::InvalidInputException::InvalidInputException(auVar3._0_8_,(string *)&local_38);
  __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}